

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_segment_suite.cpp
# Opt level: O1

void api_suite::api_data_const(void)

{
  reference piVar1;
  const_segment cVar2;
  initializer_list<int> input;
  initializer_list<int> input_00;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  circular_view<int,_18446744073709551615UL> original;
  circular_view<int,_18446744073709551615UL> local_88;
  basic_iterator<const_int> local_68;
  type local_58 [6];
  circular_view<int,_18446744073709551615UL> local_40;
  
  local_88.member.data = local_58;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_40.member.cap = 4;
  local_40.member.size = 0;
  local_40.member.next = 4;
  local_88.member.size = 0;
  local_88.member.next = 4;
  local_88.member.cap = 4;
  local_40.member.data = local_88.member.data;
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::first_segment(&local_88);
  boost::detail::test_impl
            ("first.data() == nullptr",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x46,"void api_suite::api_data_const()",cVar2.member.head == (pointer)0x0);
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::first_segment(&local_88);
  boost::detail::test_impl
            ("cfirst.data() == nullptr",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x48,"void api_suite::api_data_const()",cVar2.member.head == (pointer)0x0);
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::last_segment(&local_88);
  boost::detail::test_impl
            ("last.data() == nullptr",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x4a,"void api_suite::api_data_const()",cVar2.member.head == (pointer)0x0);
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::last_segment(&local_88);
  boost::detail::test_impl
            ("clast.data() == nullptr",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x4c,"void api_suite::api_data_const()",cVar2.member.head == (pointer)0x0);
  local_88.member.data = (pointer)CONCAT44(local_88.member.data._4_4_,0xb);
  input._M_len = 1;
  input._M_array = (iterator)&local_88;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_40,input);
  local_88.member.size = local_40.member.size;
  local_88.member.next = local_40.member.next;
  local_88.member.data = local_40.member.data;
  local_88.member.cap = local_40.member.cap;
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::first_segment(&local_88);
  local_68.current = local_88.member.cap * 2;
  if ((local_68.current & local_88.member.cap * 2 - 1) == 0) {
    local_68.current = local_68.current - 1 & local_88.member.next - local_88.member.size;
  }
  else {
    local_68.current = (local_88.member.next - local_88.member.size) % local_68.current;
  }
  local_68.parent = &local_88;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     (&local_68);
  boost::detail::test_impl
            ("first.data() == &*span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x52,"void api_suite::api_data_const()",cVar2.member.head == piVar1);
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::first_segment(&local_88);
  local_68.current = local_88.member.cap * 2;
  if ((local_68.current & local_88.member.cap * 2 - 1) == 0) {
    local_68.current = local_68.current - 1 & local_88.member.next - local_88.member.size;
  }
  else {
    local_68.current = (local_88.member.next - local_88.member.size) % local_68.current;
  }
  local_68.parent = &local_88;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     (&local_68);
  boost::detail::test_impl
            ("cfirst.data() == &*span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x54,"void api_suite::api_data_const()",cVar2.member.head == piVar1);
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::last_segment(&local_88);
  local_68.current = local_88.member.cap * 2;
  if ((local_68.current & local_88.member.cap * 2 - 1) == 0) {
    local_68.current = local_68.current - 1 & local_88.member.next;
  }
  else {
    local_68.current = local_88.member.next % local_68.current;
  }
  local_68.parent = &local_88;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     (&local_68);
  boost::detail::test_impl
            ("last.data() != &*span.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x56,"void api_suite::api_data_const()",cVar2.member.head != piVar1);
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::last_segment(&local_88);
  local_68.current = local_88.member.cap * 2;
  if ((local_68.current & local_88.member.cap * 2 - 1) == 0) {
    local_68.current = local_68.current - 1 & local_88.member.next;
  }
  else {
    local_68.current = local_88.member.next % local_68.current;
  }
  local_68.parent = &local_88;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     (&local_68);
  boost::detail::test_impl
            ("clast.data() != &*span.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x58,"void api_suite::api_data_const()",cVar2.member.head != piVar1);
  local_88.member.data = (pointer)0x160000000b;
  local_88.member.cap = 0x2c00000021;
  local_88.member.size = CONCAT44(local_88.member.size._4_4_,0x37);
  input_00._M_len = 5;
  input_00._M_array = (iterator)&local_88;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_40,input_00);
  local_88.member.size = local_40.member.size;
  local_88.member.next = local_40.member.next;
  local_88.member.data = local_40.member.data;
  local_88.member.cap = local_40.member.cap;
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::first_segment(&local_88);
  local_68.current = local_88.member.cap * 2;
  if ((local_68.current & local_88.member.cap * 2 - 1) == 0) {
    local_68.current = local_68.current - 1 & local_88.member.next - local_88.member.size;
  }
  else {
    local_68.current = (local_88.member.next - local_88.member.size) % local_68.current;
  }
  local_68.parent = &local_88;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     (&local_68);
  boost::detail::test_impl
            ("first.data() == &*span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x60,"void api_suite::api_data_const()",cVar2.member.head == piVar1);
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::first_segment(&local_88);
  local_68.current = local_88.member.cap * 2;
  if ((local_68.current & local_88.member.cap * 2 - 1) == 0) {
    local_68.current = local_68.current - 1 & local_88.member.next - local_88.member.size;
  }
  else {
    local_68.current = (local_88.member.next - local_88.member.size) % local_68.current;
  }
  local_68.parent = &local_88;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     (&local_68);
  boost::detail::test_impl
            ("cfirst.data() == &*span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x62,"void api_suite::api_data_const()",cVar2.member.head == piVar1);
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::last_segment(&local_88);
  local_68.current = local_88.member.cap * 2;
  if ((local_68.current & local_88.member.cap * 2 - 1) == 0) {
    local_68.current = local_68.current - 1 & local_88.member.next - local_88.member.size;
  }
  else {
    local_68.current = (local_88.member.next - local_88.member.size) % local_68.current;
  }
  local_68.parent = &local_88;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     (&local_68);
  boost::detail::test_impl
            ("last.data() != &*span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,100,"void api_suite::api_data_const()",cVar2.member.head != piVar1);
  cVar2 = vista::circular_view<int,_18446744073709551615UL>::last_segment(&local_88);
  local_68.current = local_88.member.cap * 2;
  if ((local_68.current & local_88.member.cap * 2 - 1) == 0) {
    local_68.current = local_68.current - 1 & local_88.member.next - local_88.member.size;
  }
  else {
    local_68.current = (local_88.member.next - local_88.member.size) % local_68.current;
  }
  local_68.parent = &local_88;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator*
                     (&local_68);
  boost::detail::test_impl
            ("clast.data() != &*span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x66,"void api_suite::api_data_const()",cVar2.member.head != piVar1);
  return;
}

Assistant:

void api_data_const()
{
    int array[4] = {};
    circular_view<int> original(array);
    {
        const circular_view<int> span(original);
        auto first = span.first_segment();
        BOOST_TEST(first.data() == nullptr);
        const auto cfirst = span.first_segment();
        BOOST_TEST(cfirst.data() == nullptr);
        auto last = span.last_segment();
        BOOST_TEST(last.data() == nullptr);
        const auto clast = span.last_segment();
        BOOST_TEST(clast.data() == nullptr);
    }
    original = { 11 };
    {
        const circular_view<int> span(original);
        auto first = span.first_segment();
        BOOST_TEST(first.data() == &*span.begin());
        const auto cfirst = span.first_segment();
        BOOST_TEST(cfirst.data() == &*span.begin());
        auto last = span.last_segment();
        BOOST_TEST(last.data() != &*span.end());
        const auto clast = span.last_segment();
        BOOST_TEST(clast.data() != &*span.end());
    }
    // 55 22 33 44
    // -> <-------
    original = { 11, 22, 33, 44, 55 };
    {
        const circular_view<int> span(original);
        auto first = span.first_segment();
        BOOST_TEST(first.data() == &*span.begin());
        const auto cfirst = span.first_segment();
        BOOST_TEST(cfirst.data() == &*span.begin());
        auto last = span.last_segment();
        BOOST_TEST(last.data() != &*span.begin());
        const auto clast = span.last_segment();
        BOOST_TEST(clast.data() != &*span.begin());
    }
}